

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::setNamedItemNS(QDomNamedNodeMapPrivate *this,QDomNodePrivate *arg)

{
  int iVar1;
  undefined4 extraout_var;
  QDomNodePrivate *pQVar2;
  long in_FS_OFFSET;
  iterator iStack_58;
  QArrayDataPointer<char16_t> local_40;
  QDomNodePrivate *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QDomNodePrivate *)0x0;
  local_28 = arg;
  if ((arg != (QDomNodePrivate *)0x0) && (this->readonly == false)) {
    if (this->appendToParent == true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        iVar1 = (*this->parent->_vptr_QDomNodePrivate[7])(this->parent,arg);
        return (QDomNodePrivate *)CONCAT44(extraout_var,iVar1);
      }
      goto LAB_0010fa6c;
    }
    if ((arg->prefix).d.ptr == (char16_t *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pQVar2 = setNamedItem(this,arg);
        return pQVar2;
      }
      goto LAB_0010fa6c;
    }
    pQVar2 = namedItemNS(this,&arg->namespaceURI,&arg->name);
    LOCK();
    (arg->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (arg->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_40.d = (local_28->name).d.d;
    local_40.ptr = (local_28->name).d.ptr;
    local_40.size = (local_28->name).d.size;
    if (local_40.d != (Data *)0x0) {
      LOCK();
      ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
              (&iStack_58,&this->map,(QString *)&local_40,&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar2;
  }
LAB_0010fa6c:
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::setNamedItemNS(QDomNodePrivate* arg)
{
    if (readonly || !arg)
        return nullptr;

    if (appendToParent)
        return parent->appendChild(arg);

    if (!arg->prefix.isNull()) {
        // node has a namespace
        QDomNodePrivate *n = namedItemNS(arg->namespaceURI, arg->name);
        // We take a reference
        arg->ref.ref();
        map.insert(arg->nodeName(), arg);
        return n;
    } else {
        // ### check the following code if it is ok
        return setNamedItem(arg);
    }
}